

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::matchNext
          (InstMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  bool bVar1;
  undefined7 in_register_00000009;
  TermList queryTerm;
  
  if ((int)CONCAT71(in_register_00000009,separate) != 0) {
    Lib::Stack<Kernel::TermList>::push(&this->_boundVars,(TermList)0x2);
  }
  queryTerm._content._4_4_ = 0;
  queryTerm._content._0_4_ = specVar * 4 + 3;
  bVar1 = matchNextAux(this,queryTerm,nodeTerm,separate);
  return bVar1;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(TermList::empty());
  }

#if VDEBUG
  {
    //we assert that all the special variables in the nodeTerm are unbound
    VariableIterator vit(nodeTerm);
    while(vit.hasNext()) {
      TermList var=vit.next();
      if(var.isSpecialVar()) {
  ASS(!isBound(var));
      }
    }
  }
#endif
  return matchNextAux(TermList(specVar, true), nodeTerm, separate);
}